

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_dense.c
# Opt level: O2

int check_vector(N_Vector X,N_Vector Y,realtype tol)

{
  double dVar1;
  realtype *prVar2;
  realtype *prVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  
  prVar2 = N_VGetArrayPointer(X);
  prVar3 = N_VGetArrayPointer(Y);
  lVar4 = N_VGetLength_Serial(X);
  lVar5 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar5;
  }
  iVar6 = 0;
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    uVar7 = 1;
    if (!NAN(prVar2[lVar5])) {
      uVar7 = (uint)(tol < ABS(prVar2[lVar5] - prVar3[lVar5]));
    }
    iVar6 = iVar6 + uVar7;
  }
  if (iVar6 == 0) {
    iVar6 = 0;
  }
  else {
    dVar8 = 0.0;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      dVar1 = ABS(prVar2[lVar5] - prVar3[lVar5]);
      if (ABS(prVar2[lVar5] - prVar3[lVar5]) <= dVar8) {
        dVar1 = dVar8;
      }
      dVar8 = dVar1;
    }
    printf("check err failure: maxerr = %g (tol = %g)\n");
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, realtype tol)
{
  int failure = 0;
  sunindextype i, local_length;
  realtype *Xdata, *Ydata, maxerr;
  
  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);
  local_length = N_VGetLength_Serial(X);
  
  /* check vector data */
  for(i=0; i < local_length; i++)
    failure += FNEQ(Xdata[i], Ydata[i], tol);

  if (failure > ZERO) {
    maxerr = ZERO;
    for(i=0; i < local_length; i++)
      maxerr = SUNMAX(SUNRabs(Xdata[i]-Ydata[i]), maxerr);
    printf("check err failure: maxerr = %g (tol = %g)\n",
	   maxerr, tol);
    return(1);
  }
  else
    return(0);
}